

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O1

BtorSimBitVector * btorsim_bv_add(BtorSimBitVector *a,BtorSimBitVector *b)

{
  uint bw;
  ulong uVar1;
  BtorSimBitVector *pBVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  
  bw = a->width;
  if (bw < 0x41) {
    uVar5 = a->len;
    uVar4 = (ulong)uVar5;
    if (uVar4 == 0) {
      uVar1 = 0;
    }
    else {
      lVar7 = 0;
      uVar1 = 0;
      do {
        uVar5 = uVar5 - 1;
        uVar1 = uVar1 | (ulong)*(uint *)((long)&a[1].width + lVar7) << ((char)uVar5 * ' ' & 0x3fU);
        lVar7 = lVar7 + 4;
      } while (uVar4 << 2 != lVar7);
    }
    uVar5 = b->len;
    uVar4 = (ulong)uVar5;
    if (uVar4 == 0) {
      uVar6 = 0;
    }
    else {
      lVar7 = 0;
      uVar6 = 0;
      do {
        uVar5 = uVar5 - 1;
        uVar6 = uVar6 | (ulong)*(uint *)((long)&b[1].width + lVar7) << ((char)uVar5 * ' ' & 0x3fU);
        lVar7 = lVar7 + 4;
      } while (uVar4 << 2 != lVar7);
    }
    pBVar2 = btorsim_bv_uint64_to_bv(uVar6 + uVar1,bw);
  }
  else {
    pBVar2 = btorsim_bv_new(bw);
    uVar4 = 0;
    lVar7 = (ulong)(a->len - 1) + 2;
    do {
      uVar4 = (ulong)(&b->width)[lVar7] + (&a->width)[lVar7] + uVar4;
      (&pBVar2->width)[lVar7] = (uint32_t)uVar4;
      uVar4 = uVar4 >> 0x20;
      lVar3 = lVar7 + -2;
      bVar8 = lVar7 != 2;
      lVar7 = lVar7 + -1;
    } while (bVar8 && -1 < lVar3);
  }
  if ((ulong)pBVar2->len << 5 != (ulong)pBVar2->width) {
    pBVar2[1].width = pBVar2[1].width & 0x7fffffffU >> (~(byte)pBVar2->width & 0x1f);
  }
  return pBVar2;
}

Assistant:

BtorSimBitVector *
btorsim_bv_add (const BtorSimBitVector *a, const BtorSimBitVector *b)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  int64_t i;
  uint64_t x, y, sum;
  BtorSimBitVector *res;
  BTORSIM_BV_TYPE carry;

  if (a->width <= 64)
  {
    x   = btorsim_bv_to_uint64 (a);
    y   = btorsim_bv_to_uint64 (b);
    res = btorsim_bv_uint64_to_bv (x + y, a->width);
  }
  else
  {
    res   = btorsim_bv_new (a->width);
    carry = 0;
    for (i = a->len - 1; i >= 0; i--)
    {
      sum          = (uint64_t) a->bits[i] + b->bits[i] + carry;
      res->bits[i] = (BTORSIM_BV_TYPE) sum;
      carry        = (BTORSIM_BV_TYPE) (sum >> 32);
    }
  }

  set_rem_bits_to_zero (res);
  assert (rem_bits_zero_dbg (res));
  return res;
}